

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

void __thiscall re2::Compiler::Add_80_10ffff(Compiler *this)

{
  uint uVar1;
  int iVar2;
  uint8 *puVar3;
  int i;
  long lVar4;
  int inst [12];
  int local_58 [14];
  
  local_58[8] = 0;
  local_58[9] = 0;
  local_58[10] = 0;
  local_58[0xb] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  puVar3 = &DAT_00140618;
  lVar4 = 0;
  do {
    iVar2 = 0;
    if (-1 < (long)*(int *)(puVar3 + -8)) {
      iVar2 = local_58[*(int *)(puVar3 + -8)];
    }
    uVar1 = *(uint *)(puVar3 + -4);
    iVar2 = UncachedRuneByteSuffix(this,(uint8)uVar1,*puVar3,false,iVar2);
    local_58[lVar4] = iVar2;
    if ((uVar1 & 0xc0) != 0x80) {
      AddSuffix(this,iVar2);
    }
    lVar4 = lVar4 + 1;
    puVar3 = puVar3 + 0xc;
  } while (lVar4 != 0xc);
  return;
}

Assistant:

void Compiler::Add_80_10ffff() {
  int inst[arraysize(prog_80_10ffff)] = { 0 }; // does not need to be initialized; silences gcc warning
  for (int i = 0; i < arraysize(prog_80_10ffff); i++) {
    const ByteRangeProg& p = prog_80_10ffff[i];
    int next = 0;
    if (p.next >= 0)
      next = inst[p.next];
    inst[i] = UncachedRuneByteSuffix(static_cast<uint8>(p.lo),
                                     static_cast<uint8>(p.hi), false, next);
    if ((p.lo & 0xC0) != 0x80)
      AddSuffix(inst[i]);
  }
}